

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_4::SingularPrimitive::
GenerateSerializeWithCachedSizesToArray(SingularPrimitive *this,Printer *p)

{
  Printer *pPVar1;
  int iVar2;
  Type TVar3;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  Printer *local_18;
  Printer *p_local;
  SingularPrimitive *this_local;
  
  local_18 = p;
  p_local = (Printer *)this;
  iVar2 = FieldDescriptor::number((this->super_FieldGeneratorBase).field_);
  if (iVar2 < 0x10) {
    TVar3 = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
    if (TVar3 != TYPE_INT32) {
      TVar3 = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
      if (TVar3 != TYPE_INT64) {
        TVar3 = FieldDescriptor::type((this->super_FieldGeneratorBase).field_);
        if (TVar3 != TYPE_ENUM) goto LAB_004cc65c;
      }
    }
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,
               "\n      target =\n          $pbi$::WireFormatLite::Write$declared_type$ToArrayWithField<$number$>(\n              stream, this_._internal_$name$(), target);\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_28._M_len,local_28._M_str);
  }
  else {
LAB_004cc65c:
    pPVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_40,
               "\n      target = stream->EnsureSpace(target);\n      target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(\n          $number$, this_._internal_$name$(), target);\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit(pPVar1,local_40._M_len,local_40._M_str);
  }
  return;
}

Assistant:

void SingularPrimitive::GenerateSerializeWithCachedSizesToArray(
    io::Printer* p) const {
  if ((field_->number() < 16) &&
      (field_->type() == FieldDescriptor::TYPE_INT32 ||
       field_->type() == FieldDescriptor::TYPE_INT64 ||
       field_->type() == FieldDescriptor::TYPE_ENUM)) {
    // Call special non-inlined routine with tag number hardcoded as a
    // template parameter that handles the EnsureSpace and the writing
    // of the tag+value to the array
    p->Emit(R"cc(
      target =
          $pbi$::WireFormatLite::Write$declared_type$ToArrayWithField<$number$>(
              stream, this_._internal_$name$(), target);
    )cc");
  } else {
    p->Emit(R"cc(
      target = stream->EnsureSpace(target);
      target = ::_pbi::WireFormatLite::Write$DeclaredType$ToArray(
          $number$, this_._internal_$name$(), target);
    )cc");
  }
}